

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushItemWidth(float item_width)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  float in_XMM0_Da;
  ImGuiWindow *window;
  ImGuiContext *g;
  float *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  ImVector<float>::push_back
            ((ImVector<float> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffd8);
  if ((in_XMM0_Da == 0.0) && (!NAN(in_XMM0_Da))) {
    in_XMM0_Da = pIVar1->ItemWidthDefault;
  }
  (pIVar1->DC).ItemWidth = in_XMM0_Da;
  (pIVar2->NextItemData).Flags = (pIVar2->NextItemData).Flags & 0xfffffffe;
  return;
}

Assistant:

void ImGui::PushItemWidth(float item_width)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    window->DC.ItemWidthStack.push_back(window->DC.ItemWidth); // Backup current width
    window->DC.ItemWidth = (item_width == 0.0f ? window->ItemWidthDefault : item_width);
    g.NextItemData.Flags &= ~ImGuiNextItemDataFlags_HasWidth;
}